

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

SUNErrCode SUNMatMatvec_Band(SUNMatrix A,N_Vector x,N_Vector y)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  void *__s;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar7 = N_VGetArrayPointer(x);
  __s = (void *)N_VGetArrayPointer(y);
  plVar1 = (long *)A->content;
  lVar2 = *plVar1;
  if (0 < lVar2) {
    memset(__s,0,lVar2 * 8);
  }
  lVar3 = plVar1[1];
  if (0 < lVar3) {
    lVar4 = plVar1[8];
    lVar5 = plVar1[3];
    lVar6 = plVar1[4];
    lVar10 = -lVar5;
    lVar8 = plVar1[5] << 3;
    lVar11 = 0;
    do {
      lVar12 = 0;
      if (0 < lVar10) {
        lVar12 = lVar10;
      }
      lVar9 = lVar11 - lVar5;
      if (lVar9 < 1) {
        lVar9 = 0;
      }
      lVar13 = lVar6 + lVar11;
      if (lVar2 <= lVar6 + lVar11) {
        lVar13 = lVar2 + -1;
      }
      if (lVar9 <= lVar13) {
        lVar12 = lVar12 + -1;
        lVar9 = *(long *)(lVar4 + lVar11 * 8);
        do {
          *(double *)((long)__s + lVar12 * 8 + 8) =
               *(double *)(lVar9 + lVar8 + 8 + lVar12 * 8) * *(double *)(lVar7 + lVar11 * 8) +
               *(double *)((long)__s + lVar12 * 8 + 8);
          lVar12 = lVar12 + 1;
        } while (lVar12 < lVar13);
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + -8;
    } while (lVar11 != lVar3);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatMatvec_Band(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, is, ie;
  sunrealtype *col_j, *xd, *yd;

  SUNCheck(compatibleMatrixAndVectors(A, x, y), SUN_ERR_ARG_DIMSMISMATCH);

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  SUNAssert(xd, SUN_ERR_MEM_FAIL);
  SUNAssert(yd, SUN_ERR_MEM_FAIL);

  /* Perform operation */
  for (i = 0; i < SM_ROWS_B(A); i++) { yd[i] = ZERO; }
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    col_j = SM_COLUMN_B(A, j);
    is    = SUNMAX(0, j - SM_UBAND_B(A));
    ie    = SUNMIN(SM_ROWS_B(A) - 1, j + SM_LBAND_B(A));
    for (i = is; i <= ie; i++) { yd[i] += col_j[i - j] * xd[j]; }
  }
  return SUN_SUCCESS;
}